

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::addFrameConstraint
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *constraintValue)

{
  char *pcVar1;
  char *pcVar2;
  MatrixView<const_double> local_118;
  Transform local_e8 [96];
  MatrixFixSize local_88 [128];
  
  if ((constraintValue->m_rows == 4) && (constraintValue->m_cols == 4)) {
    local_118.m_storage = constraintValue->m_storage;
    local_118.m_rows = 4;
    local_118.m_cols = 4;
    local_118.m_storageOrder = constraintValue->m_storageOrder;
    local_118.m_innerStride = constraintValue->m_innerStride;
    local_118.m_outerStride = constraintValue->m_outerStride;
    MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)local_88,&local_118);
    iDynTree::Transform::Transform(local_e8,local_88);
    pcVar2 = "";
    pcVar1 = "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics";
  }
  else {
    pcVar2 = "addFrameConstraint";
    pcVar1 = "Wrong size in input constraintValue";
  }
  iDynTree::reportError("InverseKinematics",pcVar2,pcVar1);
  return false;
}

Assistant:

bool InverseKinematics::addFrameConstraint(const std::string &frameName,
                                               iDynTree::MatrixView<const double> constraintValue)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (constraintValue.rows() == expected_transform_rows)
            && (constraintValue.cols() == expected_transform_cols);
        if( !ok )
        {
            reportError("InverseKinematics","addFrameConstraint","Wrong size in input constraintValue");
            return false;
        }

        return this->addFrameConstraint(frameName, Transform(constraintValue));
    }